

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

mat44 * nifti_make_orthog_mat44
                  (mat44 *__return_storage_ptr__,float r11,float r12,float r13,float r21,float r22,
                  float r23,float r31,float r32,float r33)

{
  mat33 A;
  undefined8 unaff_RBX;
  undefined8 unaff_R14;
  undefined8 unaff_retaddr;
  undefined8 in_stack_0000000c;
  undefined8 local_38;
  float local_30;
  undefined8 local_2c;
  float local_24;
  undefined8 local_20;
  float local_18;
  
  *(float *)((long)(__return_storage_ptr__->m + 3) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->m + 3) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->m + 3) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->m + 3) + 0xc) = 1.0;
  A.m._8_8_ = unaff_R14;
  A.m[0]._0_8_ = unaff_RBX;
  A.m[2][0] = r33;
  A.m[1]._4_8_ = unaff_retaddr;
  A.m[2]._4_8_ = in_stack_0000000c;
  nifti_mat33_polar(A);
  *(undefined8 *)__return_storage_ptr__->m[0] = local_38;
  __return_storage_ptr__->m[0][2] = local_30;
  *(undefined8 *)__return_storage_ptr__->m[1] = local_2c;
  __return_storage_ptr__->m[1][2] = local_24;
  *(undefined8 *)__return_storage_ptr__->m[2] = local_20;
  __return_storage_ptr__->m[2][2] = local_18;
  __return_storage_ptr__->m[2][3] = 0.0;
  __return_storage_ptr__->m[1][3] = 0.0;
  __return_storage_ptr__->m[0][3] = 0.0;
  return __return_storage_ptr__;
}

Assistant:

mat44 nifti_make_orthog_mat44( float r11, float r12, float r13 ,
                               float r21, float r22, float r23 ,
                               float r31, float r32, float r33  )
{
   mat44 R ;
   mat33 Q , P ;
   double val ;

   R.m[3][0] = R.m[3][1] = R.m[3][2] = 0.0l ; R.m[3][3] = 1.0l ;

   Q.m[0][0] = r11 ; Q.m[0][1] = r12 ; Q.m[0][2] = r13 ; /* load Q */
   Q.m[1][0] = r21 ; Q.m[1][1] = r22 ; Q.m[1][2] = r23 ;
   Q.m[2][0] = r31 ; Q.m[2][1] = r32 ; Q.m[2][2] = r33 ;

   /* normalize row 1 */

   val = Q.m[0][0]*Q.m[0][0] + Q.m[0][1]*Q.m[0][1] + Q.m[0][2]*Q.m[0][2] ;
   if( val > 0.0l ){
     val = 1.0l / sqrt(val) ;
     Q.m[0][0] *= (float)val ; Q.m[0][1] *= (float)val ; Q.m[0][2] *= (float)val ;
   } else {
     Q.m[0][0] = 1.0l ; Q.m[0][1] = 0.0l ; Q.m[0][2] = 0.0l ;
   }

   /* normalize row 2 */

   val = Q.m[1][0]*Q.m[1][0] + Q.m[1][1]*Q.m[1][1] + Q.m[1][2]*Q.m[1][2] ;
   if( val > 0.0l ){
     val = 1.0l / sqrt(val) ;
     Q.m[1][0] *= (float)val ; Q.m[1][1] *= (float)val ; Q.m[1][2] *= (float)val ;
   } else {
     Q.m[1][0] = 0.0l ; Q.m[1][1] = 1.0l ; Q.m[1][2] = 0.0l ;
   }

   /* normalize row 3 */

   val = Q.m[2][0]*Q.m[2][0] + Q.m[2][1]*Q.m[2][1] + Q.m[2][2]*Q.m[2][2] ;
   if( val > 0.0l ){
     val = 1.0l / sqrt(val) ;
     Q.m[2][0] *= (float)val ; Q.m[2][1] *= (float)val ; Q.m[2][2] *= (float)val ;
   } else {
     Q.m[2][0] = Q.m[0][1]*Q.m[1][2] - Q.m[0][2]*Q.m[1][1] ;  /* cross */
     Q.m[2][1] = Q.m[0][2]*Q.m[1][0] - Q.m[0][0]*Q.m[1][2] ;  /* product */
     Q.m[2][2] = Q.m[0][0]*Q.m[1][1] - Q.m[0][1]*Q.m[1][0] ;
   }

   P = nifti_mat33_polar(Q) ;  /* P is orthog matrix closest to Q */

   R.m[0][0] = P.m[0][0] ; R.m[0][1] = P.m[0][1] ; R.m[0][2] = P.m[0][2] ;
   R.m[1][0] = P.m[1][0] ; R.m[1][1] = P.m[1][1] ; R.m[1][2] = P.m[1][2] ;
   R.m[2][0] = P.m[2][0] ; R.m[2][1] = P.m[2][1] ; R.m[2][2] = P.m[2][2] ;

   R.m[0][3] = R.m[1][3] = R.m[2][3] = 0.0f ; return R ;
}